

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int libssh2_sftp_fstatvfs(LIBSSH2_SFTP_HANDLE *handle,LIBSSH2_SFTP_STATVFS *st)

{
  time_t start_time;
  time_t entry_time;
  int rc;
  LIBSSH2_SFTP_STATVFS *st_local;
  LIBSSH2_SFTP_HANDLE *handle_local;
  
  if ((handle == (LIBSSH2_SFTP_HANDLE *)0x0) || (st == (LIBSSH2_SFTP_STATVFS *)0x0)) {
    handle_local._4_4_ = -0x27;
  }
  else {
    start_time = time((time_t *)0x0);
    do {
      entry_time._4_4_ = sftp_fstatvfs(handle,st);
      if ((entry_time._4_4_ != -0x25) || (handle->sftp->channel->session->api_block_mode == 0))
      break;
      entry_time._4_4_ = _libssh2_wait_socket(handle->sftp->channel->session,start_time);
    } while (entry_time._4_4_ == 0);
    handle_local._4_4_ = entry_time._4_4_;
  }
  return handle_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_sftp_fstatvfs(LIBSSH2_SFTP_HANDLE *handle, LIBSSH2_SFTP_STATVFS *st)
{
    int rc;
    if(!handle || !st)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, handle->sftp->channel->session,
                 sftp_fstatvfs(handle, st));
    return rc;
}